

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::add_torrent_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,add_torrent_alert *this)

{
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  element_type *this_00;
  ulong uVar4;
  error_category *peVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  char *in_RCX;
  span<const_char> in;
  allocator<char> local_30d [13];
  string local_300;
  string local_2e0;
  aux *local_2c0;
  char *local_2b8;
  char **local_2b0;
  char *torrent_name;
  char info_hash [41];
  char msg [600];
  add_torrent_alert *this_local;
  
  local_2b0 = &torrent_name;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&(this->params).ti);
  if (bVar2) {
    this_00 = std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->params).ti);
    libtorrent::torrent_info::name_abi_cxx11_(this_00);
    local_2b0 = (char **)std::__cxx11::string::c_str();
  }
  else {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_2b0 = (char **)std::__cxx11::string::c_str();
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_2b0 = (char **)std::__cxx11::string::c_str();
      }
      else {
        span<char_const>::span<libtorrent::digest32<160l>,char,void>
                  ((span<char_const> *)&local_2c0,&(this->params).info_hash);
        in.m_len = (difference_type)&torrent_name;
        in.m_ptr = local_2b8;
        libtorrent::aux::to_hex(local_2c0,in,in_RCX);
      }
    }
  }
  bVar2 = boost::system::error_code::operator_cast_to_bool(&this->error);
  ppcVar1 = local_2b0;
  if (bVar2) {
    peVar5 = boost::system::error_code::category(&this->error);
    iVar3 = (**peVar5->_vptr_error_category)();
    boost::system::error_code::message_abi_cxx11_(&local_300,&this->error);
    convert_from_native(&local_2e0,&local_300);
    uVar6 = std::__cxx11::string::c_str();
    snprintf(info_hash + 0x28,600,"failed to add torrent \"%s\": [%s] %s",ppcVar1,
             CONCAT44(extraout_var,iVar3),uVar6);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
  }
  else {
    snprintf(info_hash + 0x28,600,"added torrent: %s",local_2b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,info_hash + 0x28,local_30d);
  std::allocator<char>::~allocator(local_30d);
  return __return_storage_ptr__;
}

Assistant:

std::string add_torrent_alert::message() const
	{
		char msg[600];
		char info_hash[41];
		char const* torrent_name = info_hash;
		if (params.ti) torrent_name = params.ti->name().c_str();
		else if (!params.name.empty()) torrent_name = params.name.c_str();
#if TORRENT_ABI_VERSION == 1
		else if (!params.url.empty()) torrent_name = params.url.c_str();
#endif
		else aux::to_hex(params.info_hash, info_hash);

		if (error)
		{
			std::snprintf(msg, sizeof(msg), "failed to add torrent \"%s\": [%s] %s"
				, torrent_name, error.category().name()
				, convert_from_native(error.message()).c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "added torrent: %s", torrent_name);
		}
		return msg;
	}